

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ContinueStatement * __thiscall
slang::BumpAllocator::emplace<slang::ast::ContinueStatement,slang::SourceRange>
          (BumpAllocator *this,SourceRange *args)

{
  SourceLocation SVar1;
  SourceLocation SVar2;
  ContinueStatement *pCVar3;
  
  pCVar3 = (ContinueStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ContinueStatement *)this->endPtr < pCVar3 + 1) {
    pCVar3 = (ContinueStatement *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pCVar3 + 1);
  }
  SVar1 = args->startLoc;
  SVar2 = args->endLoc;
  (pCVar3->super_Statement).kind = Continue;
  (pCVar3->super_Statement).syntax = (StatementSyntax *)0x0;
  (pCVar3->super_Statement).sourceRange.startLoc = SVar1;
  (pCVar3->super_Statement).sourceRange.endLoc = SVar2;
  return pCVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }